

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

int32_t __thiscall
SQCompilation::CheckerVisitor::normalizeParamNameLength(CheckerVisitor *this,SQChar *name)

{
  int32_t r;
  SQChar *name_local;
  CheckerVisitor *this_local;
  
  r = 0;
  for (name_local = name; *name_local != '\0'; name_local = name_local + 1) {
    if (*name_local != '_') {
      r = r + 1;
    }
  }
  return r;
}

Assistant:

int32_t CheckerVisitor::normalizeParamNameLength(const SQChar *name) {
  int32_t r = 0;

  while (*name) {
    if (*name != '_')
      ++r;
    ++name;
  }

  return r;
}